

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::AesGcmV1::AesGcmV1(AesGcmV1 *this,AesGcmV1 *other213)

{
  *(undefined ***)this = &PTR__AesGcmV1_024c8af8;
  (this->aad_prefix)._M_dataplus._M_p = (pointer)&(this->aad_prefix).field_2;
  (this->aad_prefix)._M_string_length = 0;
  (this->aad_prefix).field_2._M_local_buf[0] = '\0';
  (this->aad_file_unique)._M_dataplus._M_p = (pointer)&(this->aad_file_unique).field_2;
  (this->aad_file_unique)._M_string_length = 0;
  (this->aad_file_unique).field_2._M_local_buf[0] = '\0';
  this->__isset = (_AesGcmV1__isset)((byte)this->__isset & 0xf8);
  std::__cxx11::string::_M_assign((string *)&this->aad_prefix);
  std::__cxx11::string::_M_assign((string *)&this->aad_file_unique);
  this->supply_aad_prefix = other213->supply_aad_prefix;
  this->__isset = other213->__isset;
  return;
}

Assistant:

AesGcmV1::AesGcmV1(const AesGcmV1& other213) {
  aad_prefix = other213.aad_prefix;
  aad_file_unique = other213.aad_file_unique;
  supply_aad_prefix = other213.supply_aad_prefix;
  __isset = other213.__isset;
}